

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

int __thiscall cmXMLParser::ParseFile(cmXMLParser *this,char *file)

{
  byte bVar1;
  streambuf *psVar2;
  undefined8 uVar3;
  string local_3d0 [32];
  ostringstream local_3b0 [8];
  ostringstream str;
  long local_228;
  ifstream ifs;
  char *file_local;
  cmXMLParser *this_local;
  
  if (file == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    std::ifstream::ifstream(&local_228,file,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_3b0);
      psVar2 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_3b0,psVar2);
      std::__cxx11::ostringstream::str();
      uVar3 = std::__cxx11::string::c_str();
      this_local._4_4_ = (*this->_vptr_cmXMLParser[2])(this,uVar3);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::ostringstream::~ostringstream(local_3b0);
    }
    else {
      this_local._4_4_ = 0;
    }
    std::ifstream::~ifstream(&local_228);
  }
  return this_local._4_4_;
}

Assistant:

int cmXMLParser::ParseFile(const char* file)
{
  if (!file) {
    return 0;
  }

  cmsys::ifstream ifs(file);
  if (!ifs) {
    return 0;
  }

  std::ostringstream str;
  str << ifs.rdbuf();
  return this->Parse(str.str().c_str());
}